

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  void *pvVar1;
  LogMessage *other;
  LinearKernel *pLVar2;
  PolyKernel *pPVar3;
  SigmoidKernel *pSVar4;
  RBFKernel *pRVar5;
  PolyKernel *from_00;
  SigmoidKernel *from_01;
  LinearKernel *from_02;
  RBFKernel *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/SVM.pb.cc"
               ,0x510);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    if (this->_oneof_case_[0] != 1) {
      clear_kernel(this);
      this->_oneof_case_[0] = 1;
      pLVar2 = (LinearKernel *)operator_new(0x18);
      LinearKernel::LinearKernel(pLVar2);
      (this->kernel_).linearkernel_ = pLVar2;
    }
    pLVar2 = (this->kernel_).linearkernel_;
    if (from->_oneof_case_[0] == 1) {
      from_02 = (from->kernel_).linearkernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_02 = (LinearKernel *)&_LinearKernel_default_instance_;
    }
    LinearKernel::MergeFrom(pLVar2,from_02);
    break;
  case 2:
    if (this->_oneof_case_[0] != 2) {
      clear_kernel(this);
      this->_oneof_case_[0] = 2;
      pRVar5 = (RBFKernel *)operator_new(0x20);
      RBFKernel::RBFKernel(pRVar5);
      (this->kernel_).rbfkernel_ = pRVar5;
    }
    pRVar5 = (this->kernel_).rbfkernel_;
    if (from->_oneof_case_[0] == 2) {
      from_03 = (from->kernel_).rbfkernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (RBFKernel *)&_RBFKernel_default_instance_;
    }
    RBFKernel::MergeFrom(pRVar5,from_03);
    break;
  case 3:
    if (this->_oneof_case_[0] != 3) {
      clear_kernel(this);
      this->_oneof_case_[0] = 3;
      pPVar3 = (PolyKernel *)operator_new(0x28);
      PolyKernel::PolyKernel(pPVar3);
      (this->kernel_).polykernel_ = pPVar3;
    }
    pPVar3 = (this->kernel_).polykernel_;
    if (from->_oneof_case_[0] == 3) {
      from_00 = (from->kernel_).polykernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_00 = (PolyKernel *)&_PolyKernel_default_instance_;
    }
    PolyKernel::MergeFrom(pPVar3,from_00);
    break;
  case 4:
    if (this->_oneof_case_[0] != 4) {
      clear_kernel(this);
      this->_oneof_case_[0] = 4;
      pSVar4 = (SigmoidKernel *)operator_new(0x28);
      SigmoidKernel::SigmoidKernel(pSVar4);
      (this->kernel_).sigmoidkernel_ = pSVar4;
    }
    pSVar4 = (this->kernel_).sigmoidkernel_;
    if (from->_oneof_case_[0] == 4) {
      from_01 = (from->kernel_).sigmoidkernel_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_01 = (SigmoidKernel *)&_SigmoidKernel_default_instance_;
    }
    SigmoidKernel::MergeFrom(pSVar4,from_01);
  }
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from.linearkernel());
      break;
    }
    case kRbfKernel: {
      mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from.rbfkernel());
      break;
    }
    case kPolyKernel: {
      mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from.polykernel());
      break;
    }
    case kSigmoidKernel: {
      mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from.sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
}